

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emulator.cpp
# Opt level: O0

int __thiscall Emulator::run(Emulator *this)

{
  Console *this_00;
  thread *in_RDI;
  Console *c;
  type *in_stack_ffffffffffffffc8;
  thread *in_stack_ffffffffffffffd0;
  
  isRunning = true;
  this_00 = Console::Instance();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,(string *)(in_RDI + 1));
  Console::init(this_00,(EVP_PKEY_CTX *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::thread::thread<Emulator::run()::__0,,void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::thread::operator=((thread *)this_00,in_RDI);
  std::thread::~thread((thread *)0x10e049);
  while ((isRunning & 1U) != 0) {
    mainLoopStep();
    SDL_Delay(3);
  }
  return 0;
}

Assistant:

int Emulator::run() {
    isRunning = true;
    Console &c = Console::Instance();
    c.init(filename);
    thread = std::thread([&]() { mainLoop(); });
#ifdef __EMSCRIPTEN__
    emscripten_set_keydown_callback(EMSCRIPTEN_EVENT_TARGET_WINDOW, c.getController(), true, keyCallback);
    emscripten_set_keyup_callback(EMSCRIPTEN_EVENT_TARGET_WINDOW, c.getController(), true, keyCallback);
    emscripten_set_main_loop(mainLoopStep, 0, 1);
#else
    while(isRunning) {
        mainLoopStep();
        SDL_Delay(idealFrameTime / 5);
    }
#endif
    return 0;
}